

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_pipe_recv_start(tcptran_pipe *p)

{
  int iVar1;
  nni_aio *aio_00;
  nni_aio *aio;
  nni_iov iov;
  nni_aio *rxaio;
  tcptran_pipe *p_local;
  
  iov.iov_len = (size_t)&p->rxaio;
  if (p->rxmsg != (nni_msg *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/tcp/tcp.c"
              ,0x209,"p->rxmsg == NULL");
  }
  if ((p->closed & 1U) == 0) {
    iVar1 = nni_list_empty(&p->recvq);
    if (iVar1 == 0) {
      aio = (nni_aio *)p->rxlen;
      iov.iov_buf = (void *)0x8;
      nni_aio_set_iov((nni_aio *)iov.iov_len,1,(nni_iov *)&aio);
      nng_stream_recv(p->conn,(nng_aio *)iov.iov_len);
    }
  }
  else {
    while (aio_00 = (nni_aio *)nni_list_first(&p->recvq), aio_00 != (nni_aio *)0x0) {
      nni_list_remove(&p->recvq,aio_00);
      nni_aio_finish_error(aio_00,NNG_ECLOSED);
    }
  }
  return;
}

Assistant:

static void
tcptran_pipe_recv_start(tcptran_pipe *p)
{
	nni_aio *rxaio = &p->rxaio;
	nni_iov  iov;
	NNI_ASSERT(p->rxmsg == NULL);

	if (p->closed) {
		nni_aio *aio;
		while ((aio = nni_list_first(&p->recvq)) != NULL) {
			nni_list_remove(&p->recvq, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		return;
	}
	if (nni_list_empty(&p->recvq)) {
		return;
	}

	// Schedule a read of the header.
	iov.iov_buf = p->rxlen;
	iov.iov_len = sizeof(p->rxlen);
	nni_aio_set_iov(rxaio, 1, &iov);

	nng_stream_recv(p->conn, rxaio);
}